

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::StreamExpressionSyntax::setChild
          (StreamExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  StreamExpressionWithRangeSyntax *pSVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  
  ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  if (index == 0) {
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar3 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar3 = *ppSVar1;
    }
    (this->expression).ptr = (ExpressionSyntax *)pSVar3;
  }
  else {
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar2 = (StreamExpressionWithRangeSyntax *)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar2 = (StreamExpressionWithRangeSyntax *)*ppSVar1;
    }
    this->withRange = pSVar2;
  }
  return;
}

Assistant:

void StreamExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expression = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: withRange = child.node() ? &child.node()->as<StreamExpressionWithRangeSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}